

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

UnknownFieldSet * __thiscall
google::protobuf::Reflection::MutableUnknownFields(Reflection *this,Message *message)

{
  ulong uVar1;
  UnknownFieldSet *pUVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(uint)(this->schema_).metadata_offset_;
  uVar1 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3);
  if ((uVar1 & 1) != 0) {
    return (UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8);
  }
  pUVar2 = internal::InternalMetadata::
           mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                     ((InternalMetadata *)
                      ((long)&(message->super_MessageLite)._vptr_MessageLite + uVar3));
  return pUVar2;
}

Assistant:

UnknownFieldSet* Reflection::MutableUnknownFields(Message* message) const {
  return MutableInternalMetadata(message)
      ->mutable_unknown_fields<UnknownFieldSet>();
}